

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O1

int demoClose(unqlite_file *pFile)

{
  int iVar1;
  
  if (*(int *)&pFile[4].pMethods == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = demoDirectWrite((DemoFile *)pFile,pFile[3].pMethods,*(int *)&pFile[4].pMethods,
                            (unqlite_int64)pFile[5].pMethods);
    *(undefined4 *)&pFile[4].pMethods = 0;
  }
  unqlite_free(pFile[3].pMethods);
  close(*(int *)&pFile[2].pMethods);
  return iVar1;
}

Assistant:

static int demoClose(unqlite_file *pFile){
  int rc;
  DemoFile *p = (DemoFile*)pFile;
  rc = demoFlushBuffer(p);
  unqlite_free(p->aBuffer);
  close(p->fd);
  return rc;
}